

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O2

Index __thiscall
Eigen::internal::CompressedStorage<double,_int>::searchLowerIndex
          (CompressedStorage<double,_int> *this,Index start,Index end,Index key)

{
  long lVar1;
  
  while (lVar1 = end, start < lVar1) {
    end = start + lVar1 >> 1;
    if (this->m_indices[end] < key) {
      start = end + 1;
      end = lVar1;
    }
  }
  return start;
}

Assistant:

inline Index searchLowerIndex(Index start, Index end, Index key) const
    {
      while(end>start)
      {
        Index mid = (end+start)>>1;
        if (m_indices[mid]<key)
          start = mid+1;
        else
          end = mid;
      }
      return start;
    }